

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_and_glx_different_pointers.c
# Opt level: O1

int main(void)

{
  char *__s;
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  EGLDisplay pvVar5;
  long lVar6;
  char *pcVar7;
  void *pvVar8;
  size_t __n;
  void *pvVar9;
  EGLConfig cfg;
  undefined8 local_20;
  undefined1 local_14 [4];
  
  (*_epoxy_glXGetCurrentContext)();
  (*_epoxy_eglGetCurrentContext)();
  pvVar5 = get_egl_display_or_skip();
  cVar1 = epoxy_has_egl_extension(pvVar5,"EGL_KHR_surfaceless_context");
  if (cVar1 == '\0') {
    iVar3 = 0x103126;
  }
  else {
    (*_epoxy_eglBindAPI)(0x30a0);
    iVar3 = (*_epoxy_eglChooseConfig)(pvVar5,init_egl_config_attribs,&local_20,1,local_14);
    if (iVar3 == 0) {
      iVar3 = 0x103150;
    }
    else {
      lVar6 = (*_epoxy_eglCreateContext)(pvVar5,local_20,0,init_egl_context_attribs);
      if (lVar6 != 0) {
        (*_epoxy_eglMakeCurrent)(pvVar5,0,0,lVar6);
        bVar2 = epoxy_is_desktop_gl();
        if (bVar2 != 0) {
          main_cold_1();
        }
        iVar3 = epoxy_gl_version();
        if (iVar3 < 0x14) {
          main_cold_2();
          bVar2 = 0;
        }
        else {
          bVar2 = bVar2 ^ 1;
        }
        uVar4 = (*_epoxy_glCreateShader)(0x8b30);
        if (uVar4 != 0x162e) {
          bVar2 = 0;
          fprintf(_stderr,"glCreateShader() returned %d instead of %d\n",(ulong)uVar4,0x162e);
        }
        pcVar7 = (char *)(*_epoxy_glGetString)(0x1f00);
        printf("EGL vendor: %s\n",pcVar7);
        uVar4 = 1;
        if (bVar2 != 0) {
          iVar3 = strcmp(pcVar7,"libepoxy override EGL");
          uVar4 = (uint)(iVar3 != 0);
        }
        return uVar4;
      }
      iVar3 = 0x10316b;
    }
  }
  pcVar7 = (char *)0x4d;
  errx();
  pvVar8 = dlwrap_real_dlopen(pcVar7,iVar3);
  pvVar9 = (void *)0x0;
  if (pcVar7 != (char *)0x0) {
    lVar6 = 0;
    do {
      __s = *(char **)((long)&wrapped_libs[0].filename + lVar6);
      __n = strlen(__s);
      iVar3 = strncmp(__s,pcVar7,__n);
      if (iVar3 == 0) {
        pvVar9 = (void *)((long)&wrapped_libs[0].filename + lVar6);
        break;
      }
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
  }
  if (pvVar9 != (void *)0x0) {
    *(void **)((long)pvVar9 + 0x10) = pvVar8;
    pvVar8 = pvVar9;
  }
  return (int)pvVar8;
}

Assistant:

int main(void)
{
    bool pass = true;
#ifdef USE_EGL
    EGLDisplay egl_dpy;
    EGLContext egl_ctx;
#endif
#ifdef USE_GLX
    Display *glx_dpy;
    GLXContext glx_ctx;
    Drawable glx_draw;
#endif

    /* Force epoxy to have loaded both EGL and GLX libs already -- we
     * can't assume anything about symbol resolution based on having
     * EGL or GLX loaded.
     */
    (void)glXGetCurrentContext();
    (void)eglGetCurrentContext();

#ifdef USE_GLX
    init_glx(&glx_dpy, &glx_ctx, &glx_draw);
    pass = make_glx_current_and_test(glx_dpy, glx_ctx, glx_draw) && pass;
#endif
#ifdef USE_EGL
    init_egl(&egl_dpy, &egl_ctx);
    pass = make_egl_current_and_test(egl_dpy, egl_ctx) && pass;
#endif

#if defined(USE_GLX) && defined(USE_EGL)
    pass = make_glx_current_and_test(glx_dpy, glx_ctx, glx_draw) && pass;
    pass = make_egl_current_and_test(egl_dpy, egl_ctx) && pass;
#endif

    return pass != true;
}